

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::DisplayComponents(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *pcVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  cmGraphEdge *oi;
  undefined8 *puVar8;
  
  fwrite("The strongly connected components are:\n",0x27,1,_stderr);
  pcVar1 = (this->CCG)._M_t.
           super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
           .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)*(pointer *)
                              ((long)&(pcVar1->Components).
                                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                              + 8) -
                      *(long *)&(pcVar1->Components).
                                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                                ._M_impl) / 0x18); uVar7 = uVar7 + 1) {
    fprintf(_stderr,"Component (%zu):\n",uVar7);
    lVar2 = *(long *)&(pcVar1->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl;
    lVar5 = uVar7 * 0x18;
    plVar3 = *(long **)(lVar2 + 8 + lVar5);
    for (plVar6 = *(long **)(lVar2 + lVar5); plVar6 != plVar3; plVar6 = plVar6 + 1) {
      fprintf(_stderr,"  item %zu [%s]\n",*plVar6,
              (pointer)(this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start[*plVar6].Item.Value._M_dataplus);
    }
    lVar2 = *(long *)&(((this->CCG)._M_t.
                        super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                        .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl)->
                      ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>;
    puVar4 = *(undefined8 **)(lVar2 + 8 + lVar5);
    for (puVar8 = *(undefined8 **)(lVar2 + lVar5); puVar8 != puVar4; puVar8 = puVar8 + 4) {
      fprintf(_stderr,"  followed by Component (%zu)\n",*puVar8);
    }
    fprintf(_stderr,"  topo order index %zu\n",
            (this->ComponentOrder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar7]);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayComponents()
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  for (size_t c = 0; c < components.size(); ++c) {
    fprintf(stderr, "Component (%zu):\n", c);
    NodeList const& nl = components[c];
    for (size_t i : nl) {
      fprintf(stderr, "  item %zu [%s]\n", i,
              this->EntryList[i].Item.Value.c_str());
    }
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(c);
    for (cmGraphEdge const& oi : ol) {
      size_t i = oi;
      fprintf(stderr, "  followed by Component (%zu)\n", i);
    }
    fprintf(stderr, "  topo order index %zu\n", this->ComponentOrder[c]);
  }
  fprintf(stderr, "\n");
}